

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::shr<unsigned_long>
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,unsigned_long n)

{
  sbyte sVar1;
  bool bVar2;
  limb_type_conflict val;
  unsigned_short uVar3;
  ushort uVar4;
  ulong uVar5;
  const_iterator puVar6;
  unsigned_short *puVar7;
  unsigned_short *last;
  iterator puVar8;
  reference pvVar9;
  ushort local_92;
  local_integral_type left_shift_previous_value;
  ushort local_52;
  reverse_iterator rStack_50;
  value_type_conflict3 t;
  reverse_iterator<unsigned_short_*> local_48;
  reverse_iterator r_ai;
  limb_type_conflict part_from_previous_value;
  uint_fast16_t right_shift_amount;
  ulong local_28;
  unsigned_long local_20;
  unsigned_long offset;
  unsigned_long n_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  local_28 = n >> 4;
  right_shift_amount = 3;
  offset = n;
  n_local = (unsigned_long)this;
  local_20 = detail::min_unsafe<unsigned_long>(&local_28,&right_shift_amount);
  uVar5 = offset & 0xf;
  if ((int)local_20 != 0) {
    puVar6 = detail::array_detail::array<unsigned_short,_3UL>::cbegin
                       ((array<unsigned_short,_3UL> *)this);
    puVar7 = detail::advance_and_point<unsigned_short_const*,unsigned_int>(puVar6,(uint)local_20);
    puVar6 = detail::array_detail::array<unsigned_short,_3UL>::cbegin
                       ((array<unsigned_short,_3UL> *)this);
    last = detail::advance_and_point<unsigned_short_const*,unsigned_int>(puVar6,3);
    puVar8 = detail::array_detail::array<unsigned_short,_3UL>::begin
                       ((array<unsigned_short,_3UL> *)this);
    detail::copy_unsafe<unsigned_short_const*,unsigned_short*>(puVar7,last,puVar8);
    puVar8 = detail::array_detail::array<unsigned_short,_3UL>::begin
                       ((array<unsigned_short,_3UL> *)this);
    puVar7 = detail::advance_and_point<unsigned_short*,unsigned_int>(puVar8,3 - (int)local_20);
    puVar8 = detail::array_detail::array<unsigned_short,_3UL>::end
                       ((array<unsigned_short,_3UL> *)this);
    val = right_shift_fill_value(this);
    detail::fill_unsafe<unsigned_short*,unsigned_short>(puVar7,puVar8,val);
  }
  if (uVar5 != 0) {
    bVar2 = is_neg<false>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,
                          (enable_if_t<(_false),_int> *)0x0);
    sVar1 = (sbyte)uVar5;
    if (bVar2) {
      uVar3 = std::numeric_limits<unsigned_short>::max();
      local_92 = uVar3 << (0x10U - sVar1 & 0x1f);
    }
    else {
      local_92 = 0;
    }
    r_ai.current._6_2_ = local_92;
    puVar8 = detail::array_detail::array<unsigned_short,_3UL>::begin
                       ((array<unsigned_short,_3UL> *)this);
    puVar7 = detail::advance_and_point<unsigned_short*,long>(puVar8,3 - local_20);
    detail::iterator_detail::reverse_iterator<unsigned_short_*>::reverse_iterator(&local_48,puVar7);
    while( true ) {
      rStack_50 = detail::array_detail::array<unsigned_short,_3UL>::rend
                            ((array<unsigned_short,_3UL> *)this);
      bVar2 = detail::iterator_detail::operator!=(&local_48,&stack0xffffffffffffffb0);
      if (!bVar2) break;
      pvVar9 = detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator*(&local_48);
      local_52 = *pvVar9;
      uVar4 = (ushort)((int)(uint)local_52 >> sVar1) | r_ai.current._6_2_;
      left_shift_previous_value =
           (local_integral_type)
           detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator++(&local_48,0);
      pvVar9 = detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator*
                         ((reverse_iterator<unsigned_short_*> *)&left_shift_previous_value);
      *pvVar9 = uVar4;
      r_ai.current._6_2_ = local_52 << (0x10U - sVar1 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }